

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O0

ConstIterator * __thiscall
iDynTree::SensorsList::ConstIterator::operator++(ConstIterator *this,int param_2)

{
  undefined8 *in_RSI;
  ConstIterator *in_RDI;
  ConstIterator *in_stack_00000020;
  
  (in_RDI->internalIterator)._M_current = (Sensor **)*in_RSI;
  (in_RDI->externalIterator)._M_current =
       (vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *)in_RSI[1];
  in_RDI->iteratingList =
       (vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
        *)in_RSI[2];
  operator++(in_stack_00000020);
  return in_RDI;
}

Assistant:

SensorsList::ConstIterator SensorsList::ConstIterator::operator++(int)
    {
        SensorsList::ConstIterator previous(*this);
        this->operator++();
        return previous;
    }